

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::setWeightMatrix
          (CostAttributes *this,MatrixDynSize *weights)

{
  MatrixDynSize *this_00;
  PointerType pdVar1;
  variable_if_dynamic<long,__1> vVar2;
  variable_if_dynamic<long,__1> vVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar9;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_148;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_128;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_108;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_e8;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_0>
  local_c8;
  
  lVar6 = iDynTree::MatrixDynSize::rows();
  lVar7 = iDynTree::MatrixDynSize::cols();
  if (lVar6 == lVar7) {
    uVar8 = iDynTree::MatrixDynSize::cols();
    uVar4 = iDynTree::VectorDynSize::size();
    if (uVar8 == uVar4) {
      this_00 = &this->weightMatrix;
      iDynTree::MatrixDynSize::operator=(this_00,weights);
      iVar5 = (*((this->selector).
                 super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Selector[3])();
      toEigen((Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
              &local_108,(MatrixDynSize *)CONCAT44(extraout_var,iVar5));
      vVar3.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      vVar2.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      pdVar1 = local_108.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data;
      toEigen(&local_148,this_00);
      toEigen(&local_128,this_00);
      local_c8.m_lhs.m_lhs.m_rows.m_value = vVar3.m_value;
      local_c8.m_lhs.m_lhs.m_cols.m_value = vVar2.m_value;
      local_c8.m_lhs.m_lhs.m_functor.m_other = 0.5;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pdVar1;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = vVar2.m_value;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = vVar3.m_value;
      local_c8.m_rhs.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_148.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c8.m_rhs.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_c8.m_rhs.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_c8.m_rhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_128.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c8.m_rhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_128.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_c8.m_rhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_128.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      toEigen(&local_e8,&this->gradientSubMatrix);
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>const>,0>>
                (&local_e8,&local_c8);
      toEigen(&local_108,&this->gradientSubMatrix);
      iVar5 = (*((this->selector).
                 super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Selector[3])();
      toEigen((Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
              &local_148,(MatrixDynSize *)CONCAT44(extraout_var_00,iVar5));
      local_c8.m_lhs.m_lhs.m_cols.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_c8.m_lhs._0_8_ =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
      local_c8.m_lhs.m_lhs.m_rows.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_148.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      toEigen(&local_128,&this->hessianMatrix);
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,0>>
                (&local_128,
                 (Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)&local_c8);
      return true;
    }
    pcVar9 = "The weights matrix dimensions do not match those of the specified selector.";
  }
  else {
    pcVar9 = "The weights matrix is supposed to be squared.";
  }
  iDynTree::reportError("L2NormCost","setWeightMatrix",pcVar9);
  return false;
}

Assistant:

bool setWeightMatrix(const MatrixDynSize &weights)
            {
                if (weights.rows() != weights.cols()) {
                    reportError("L2NormCost", "setWeightMatrix", "The weights matrix is supposed to be squared.");
                    return false;
                }

                if (weights.cols() != this->selector->size()) {
                    reportError("L2NormCost", "setWeightMatrix", "The weights matrix dimensions do not match those of the specified selector.");
                    return false;
                }

                this->weightMatrix = weights;
                toEigen(this->gradientSubMatrix) = 0.5 * toEigen(this->selector->asSelectorMatrix()).transpose() * (toEigen(this->weightMatrix) + toEigen(this->weightMatrix).transpose());
                toEigen(this->hessianMatrix) = toEigen(this->gradientSubMatrix) * toEigen(this->selector->asSelectorMatrix());

                return true;
            }